

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<3,_11,_11>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  undefined8 in_RAX;
  bool bVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined4 *puVar7;
  int col_2;
  int col;
  long lVar8;
  int col_1;
  undefined1 auVar9 [16];
  undefined4 uVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  undefined4 auStack_88 [2];
  Matrix<float,_2,_4> res;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38 [8];
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  int aiStack_18 [5];
  undefined4 uStack_4;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar5 = 0;
    puVar6 = (undefined8 *)local_38;
    bVar3 = true;
    do {
      bVar4 = bVar3;
      lVar8 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar5 != lVar8) {
          uVar10 = 0;
        }
        *(undefined4 *)(puVar6 + lVar8) = uVar10;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar5 = 1;
      puVar6 = (undefined8 *)((long)local_38 + 4);
      bVar3 = false;
    } while (bVar4);
    local_38 = *(undefined1 (*) [8])evalCtx->in[0].m_data;
    uStack_30 = *(undefined8 *)evalCtx->in[1].m_data;
    local_28 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_20 = *(undefined8 *)evalCtx->in[3].m_data;
  }
  else {
    local_28 = 0;
    uStack_20 = 0;
    local_38 = (undefined1  [8])0x0;
    uStack_30 = 0;
    lVar5 = 0;
    puVar6 = (undefined8 *)local_38;
    bVar3 = true;
    do {
      bVar4 = bVar3;
      lVar8 = 0;
      do {
        *(undefined4 *)(puVar6 + lVar8) =
             *(undefined4 *)((long)&sr::(anonymous_namespace)::s_constInMat4x2 + lVar5 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar5 = 0x10;
      puVar6 = (undefined8 *)((long)local_38 + 4);
      bVar3 = false;
    } while (bVar4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar5 = 0;
    puVar6 = (undefined8 *)local_58;
    bVar3 = true;
    do {
      bVar4 = bVar3;
      lVar8 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar5 != lVar8) {
          uVar10 = 0;
        }
        *(undefined4 *)(puVar6 + lVar8) = uVar10;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar5 = 1;
      puVar6 = (undefined8 *)((long)local_58 + 4);
      bVar3 = false;
    } while (bVar4);
    local_58 = *(undefined1 (*) [8])evalCtx->in[0].m_data;
    uStack_50 = *(undefined8 *)evalCtx->in[1].m_data;
    local_48 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_40 = *(undefined8 *)evalCtx->in[3].m_data;
  }
  else {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = (undefined1  [8])0x0;
    uStack_50 = 0;
    lVar5 = 0;
    puVar6 = (undefined8 *)local_58;
    bVar3 = true;
    do {
      bVar4 = bVar3;
      lVar8 = 0;
      do {
        *(undefined4 *)(puVar6 + lVar8) = *(undefined4 *)((long)&DAT_00af0b40 + lVar8 * 4 + lVar5);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar5 = 0x10;
      puVar6 = (undefined8 *)((long)local_58 + 4);
      bVar3 = false;
    } while (bVar4);
  }
  lVar5 = 0;
  puVar7 = auStack_88;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    lVar8 = 0;
    do {
      uVar10 = 0x3f800000;
      if (lVar5 != lVar8) {
        uVar10 = 0;
      }
      puVar7[lVar8 * 2] = uVar10;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar5 = 1;
    puVar7 = auStack_88 + 1;
    bVar3 = false;
  } while (bVar4);
  auVar1._8_8_ = uStack_30;
  auVar1._0_8_ = local_38;
  auVar9._8_8_ = uStack_50;
  auVar9._0_8_ = local_58;
  auVar9 = divps(auVar1,auVar9);
  auVar2._8_8_ = uStack_20;
  auVar2._0_8_ = local_28;
  auVar11._8_8_ = uStack_40;
  auVar11._0_8_ = local_48;
  auVar11 = divps(auVar2,auVar11);
  res.m_data.m_data[0].m_data[1] = auVar9._12_4_;
  fVar12 = auVar11._8_4_ + auVar9._0_4_ + auVar9._4_4_;
  fVar13 = auVar11._12_4_ + res.m_data.m_data[0].m_data[1] + auVar9._8_4_;
  res.m_data.m_data[3].m_data[0] = fVar12;
  res.m_data.m_data[3].m_data[1] = fVar13;
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  stack0xfffffffffffffff8 = CONCAT44((int)((ulong)in_RAX >> 0x20),2);
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar5]] = res.m_data.m_data[2].m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 / in1);
	}